

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O1

void aom_fft4x4_float_c(float *input,float *temp,float *output)

{
  float fVar1;
  float fVar2;
  int y;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  _y = -0x10;
  do {
    fVar7 = *(float *)((long)input + _y + 0x10);
    fVar6 = *(float *)((long)input + _y + 0x20);
    fVar1 = *(float *)((long)input + _y + 0x30);
    fVar2 = *(float *)((long)input + _y + 0x40);
    fVar9 = fVar7 + fVar1;
    fVar8 = fVar6 + fVar2;
    *(float *)((long)output + _y + 0x10) = fVar9 + fVar8;
    *(float *)((long)output + _y + 0x20) = fVar7 - fVar1;
    *(float *)((long)output + _y + 0x30) = fVar9 - fVar8;
    *(float *)((long)output + _y + 0x40) = (fVar2 - fVar6) + 0.0;
    _y = _y + 4;
  } while (_y != 0);
  _y = 0;
  pfVar3 = output;
  pfVar4 = temp;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)pfVar4 + lVar5) = pfVar3[lVar5];
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    _y = _y + 1;
    pfVar4 = pfVar4 + 4;
    pfVar3 = pfVar3 + 1;
  } while (_y != 4);
  _y = -0x10;
  do {
    fVar7 = *(float *)((long)temp + _y + 0x10);
    fVar6 = *(float *)((long)temp + _y + 0x20);
    fVar1 = *(float *)((long)temp + _y + 0x30);
    fVar2 = *(float *)((long)temp + _y + 0x40);
    fVar9 = fVar7 + fVar1;
    fVar8 = fVar6 + fVar2;
    *(float *)((long)output + _y + 0x10) = fVar9 + fVar8;
    *(float *)((long)output + _y + 0x20) = fVar7 - fVar1;
    *(float *)((long)output + _y + 0x30) = fVar9 - fVar8;
    *(float *)((long)output + _y + 0x40) = (fVar2 - fVar6) + 0.0;
    _y = _y + 4;
  } while (_y != 0);
  _y = 0;
  pfVar3 = output;
  pfVar4 = temp;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)pfVar4 + lVar5) = pfVar3[lVar5];
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    _y = _y + 1;
    pfVar4 = pfVar4 + 4;
    pfVar3 = pfVar3 + 1;
  } while (_y != 4);
  pfVar4 = temp + 10;
  pfVar3 = output + 1;
  _y = 0;
  do {
    lVar5 = 0;
    do {
      fVar6 = 0.0;
      fVar7 = 0.0;
      if (lVar5 == 4 && _y == 1) {
        fVar7 = *(float *)((long)pfVar4 + lVar5);
      }
      *(float *)((long)pfVar3 + lVar5 * 2 + -4) = *(float *)((long)pfVar4 + lVar5 + -0x28) - fVar7;
      if (_y == 1) {
        fVar6 = *(float *)((long)pfVar4 + lVar5 + -8);
      }
      fVar7 = 0.0;
      if (lVar5 == 4) {
        fVar7 = pfVar4[-7];
      }
      *(float *)((long)pfVar3 + lVar5 * 2) = fVar6 + fVar7;
      if (_y == 1) {
        fVar6 = 0.0;
        fVar7 = 0.0;
        if (lVar5 == 4 && _y == 1) {
          fVar7 = *(float *)((long)pfVar4 + lVar5);
        }
        *(float *)((long)output + lVar5 * 2 + 0x60) =
             fVar7 + *(float *)((long)pfVar4 + lVar5 + -0x28);
        if (lVar5 == 4) {
          fVar6 = pfVar4[-7];
        }
        *(float *)((long)output + lVar5 * 2 + 100) = fVar6 - *(float *)((long)pfVar4 + lVar5 + -8);
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    _y = _y + 1;
    pfVar4 = pfVar4 + 4;
    pfVar3 = pfVar3 + 8;
  } while (_y != 3);
  return;
}

Assistant:

void aom_fft4x4_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 4, aom_fft1d_4_float, simple_transpose,
                 unpack_2d_output, 1);
}